

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void google::protobuf::compiler::objectivec::EmitCommentsString<google::protobuf::FieldDescriptor>
               (Printer *printer,GenerationOptions *opts,FieldDescriptor *descriptor,
               CommentStringFlags flags)

{
  bool bVar1;
  SourceLocation location;
  SourceLocation local_80;
  
  local_80.leading_comments._M_dataplus._M_p = (pointer)&local_80.leading_comments.field_2;
  local_80.leading_comments._M_string_length = 0;
  local_80.leading_comments.field_2._M_local_buf[0] = '\0';
  local_80.trailing_comments._M_dataplus._M_p = (pointer)&local_80.trailing_comments.field_2;
  local_80.trailing_comments._M_string_length = 0;
  local_80.trailing_comments.field_2._M_local_buf[0] = '\0';
  local_80.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = FieldDescriptor::GetSourceLocation(descriptor,&local_80);
  if (bVar1) {
    EmitCommentsString(printer,opts,&local_80,flags);
  }
  SourceLocation::~SourceLocation(&local_80);
  return;
}

Assistant:

void EmitCommentsString(io::Printer* printer, const GenerationOptions& opts,
                        const TDescriptor* descriptor,
                        CommentStringFlags flags = kCommentStringFlags_None) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    EmitCommentsString(printer, opts, location, flags);
  }
}